

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcombobox.cpp
# Opt level: O0

QStyleOptionComboBox * __thiscall
QComboBoxPrivateContainer::comboStyleOption(QComboBoxPrivateContainer *this)

{
  long lVar1;
  bool bVar2;
  QStyleOptionComboBox *in_RDI;
  long in_FS_OFFSET;
  QStyleOptionComboBox *opt;
  SubControl in_stack_ffffffffffffffbc;
  QStyleOptionComboBox *widget;
  undefined7 in_stack_ffffffffffffffd8;
  undefined1 uVar3;
  Int local_10;
  Int local_c;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  uVar3 = 0;
  widget = in_RDI;
  memset(in_RDI,0xaa,0x90);
  QStyleOptionComboBox::QStyleOptionComboBox((QStyleOptionComboBox *)0x533055);
  QStyleOption::initFrom
            ((QStyleOption *)CONCAT17(uVar3,in_stack_ffffffffffffffd8),(QWidget *)widget);
  QFlags<QStyle::SubControl>::QFlags((QFlags<QStyle::SubControl> *)in_RDI,in_stack_ffffffffffffffbc)
  ;
  (widget->super_QStyleOptionComplex).subControls.super_QFlagsStorageHelper<QStyle::SubControl,_4>.
  super_QFlagsStorage<QStyle::SubControl>.i = local_c;
  QFlags<QStyle::SubControl>::QFlags((QFlags<QStyle::SubControl> *)in_RDI,in_stack_ffffffffffffffbc)
  ;
  (widget->super_QStyleOptionComplex).activeSubControls.
  super_QFlagsStorageHelper<QStyle::SubControl,_4>.super_QFlagsStorage<QStyle::SubControl>.i =
       local_10;
  bVar2 = QComboBox::isEditable((QComboBox *)in_RDI);
  widget->editable = bVar2;
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return in_RDI;
}

Assistant:

QStyleOptionComboBox QComboBoxPrivateContainer::comboStyleOption() const
{
    // ### This should use QComboBox's initStyleOption(), but it's protected
    // perhaps, we could cheat by having the QCombo private instead?
    QStyleOptionComboBox opt;
    opt.initFrom(combo);
    opt.subControls = QStyle::SC_All;
    opt.activeSubControls = QStyle::SC_None;
    opt.editable = combo->isEditable();
    return opt;
}